

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# p_lights.cpp
# Opt level: O3

void EV_StartLightStrobing(int tag,int upper,int lower,int utics,int ltics)

{
  sector_t_conflict *sector;
  DSectorEffect *pDVar1;
  uint uVar2;
  DLighting *this;
  int iVar3;
  FSectorTagIterator it;
  FSectorTagIterator local_38;
  
  if (tag == 0) {
    local_38.start = 0;
  }
  else {
    local_38.start = tagManager.TagHashFirst[(ulong)(uint)tag & 0xff];
  }
  local_38.searchtag = tag;
  uVar2 = FSectorTagIterator::Next(&local_38);
  if (-1 < (int)uVar2) {
    if (0x7ffe < upper) {
      upper = 0x7fff;
    }
    if (upper < -0x7fff) {
      upper = -0x8000;
    }
    iVar3 = 0x7fff;
    if (lower < 0x7fff) {
      iVar3 = lower;
    }
    if (iVar3 < -0x7fff) {
      iVar3 = -0x8000;
    }
    do {
      sector = sectors + uVar2;
      pDVar1 = sectors[uVar2].lightingdata.field_0.p;
      if (pDVar1 == (DSectorEffect *)0x0) {
LAB_00401c9c:
        this = (DLighting *)
               M_Malloc_Dbg(0x58,
                            "/workspace/llm4binary/github/license_all_cmakelists_25/SeongGino[P]zdoom/src/dobject.h"
                            ,0x1f9);
        DLighting::DLighting(this,(sector_t *)sector);
        (this->super_DSectorEffect).super_DThinker.super_DObject._vptr_DObject =
             (_func_int **)&PTR_StaticType_006f92b8;
        *(int *)((long)&this[1].super_DSectorEffect.super_DThinker.super_DObject.Class + 4) = ltics;
        *(int *)&this[1].super_DSectorEffect.super_DThinker.super_DObject.ObjNext = utics;
        *(int *)&this[1].super_DSectorEffect.super_DThinker.super_DObject.Class = upper;
        *(int *)((long)&this[1].super_DSectorEffect.super_DThinker.super_DObject._vptr_DObject + 4)
             = iVar3;
        *(undefined4 *)&this[1].super_DSectorEffect.super_DThinker.super_DObject._vptr_DObject = 1;
      }
      else if (((pDVar1->super_DThinker).super_DObject.ObjectFlags & 0x20) != 0) {
        (sector->lightingdata).field_0.p = (DSectorEffect *)0x0;
        goto LAB_00401c9c;
      }
      uVar2 = FSectorTagIterator::Next(&local_38);
    } while (-1 < (int)uVar2);
  }
  return;
}

Assistant:

void EV_StartLightStrobing (int tag, int upper, int lower, int utics, int ltics)
{
	int secnum;
	FSectorTagIterator it(tag);
	while ((secnum = it.Next()) >= 0)
	{
		sector_t *sec = &sectors[secnum];
		if (sec->lightingdata)
			continue;
		
		new DStrobe (sec, upper, lower, utics, ltics);
	}
}